

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_inotify_poller.cc
# Opt level: O3

optional<InotifyEvent> * __thiscall
NonrecursiveInotifyPoller::GetNextEvent
          (optional<InotifyEvent> *__return_storage_ptr__,NonrecursiveInotifyPoller *this)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar9;
  inotify_event ev;
  undefined8 local_88;
  undefined8 uStack_80;
  InotifyEventType local_78;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar8 = this->read_buffer_;
  this_00 = &this->directories_;
  do {
    uVar4 = this->read_buffer_length_;
    sVar7 = this->read_buffer_offset_;
    if (uVar4 < sVar7 + 0x10) {
      uVar4 = read(this->fd_,pcVar8,0x10000);
      if (uVar4 == 0xffffffffffffffff) {
        piVar5 = __errno_location();
        if (*piVar5 == 0xb) {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0.
                   _M_payload.path.field_2 + 8) = 0;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>)._M_engaged = 0;
          (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path
          ._M_string_length = 0;
          (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path
          .field_2._M_allocated_capacity = 0;
          *(undefined8 *)&(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0
               = 0;
          (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path
          ._M_dataplus._M_p = (pointer)0x0;
          return __return_storage_ptr__;
        }
LAB_00127b0e:
        __assert_fail("readlen >= (ssize_t)sizeof(struct inotify_event) && \"inotify read failed\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                      ,0x38,
                      "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
                     );
      }
      if ((long)uVar4 < 0x10) goto LAB_00127b0e;
      this->read_buffer_offset_ = 0;
      this->read_buffer_length_ = uVar4;
      sVar7 = 0;
    }
    uVar2 = *(ulong *)(pcVar8 + sVar7);
    uStack_80 = *(ulong *)(pcVar8 + sVar7 + 8);
    this->read_buffer_offset_ = sVar7 + 0x10;
    local_88 = uVar2;
    if (uVar4 < sVar7 + 0x10) {
      __assert_fail("read_buffer_offset_ <= read_buffer_length_ && \"Attempted to escape read buffer\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                    ,0x41,
                    "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
                   );
    }
    local_88._4_4_ = (uint)(uVar2 >> 0x20);
    uVar3 = local_88._4_4_;
    if ((short)(uVar2 >> 0x20) < 0) {
      pVar9 = std::
              _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::equal_range(&this_00->_M_t,(key_type_conflict *)&local_88);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
      uVar3 = local_88._4_4_;
    }
    if ((uVar3 >> 0xe & 1) != 0) {
      this->events_dropped_ = true;
    }
  } while (uStack_80._4_4_ == 0);
  local_68 = 0;
  local_60 = '\0';
  uVar3 = uVar3 & 0xfff;
  local_70 = &local_60;
  if (uVar3 < 0x80) {
    if (uVar3 == 2) {
      local_78 = MODIFIED;
      goto LAB_00127a01;
    }
    if (uVar3 != 0x40) {
LAB_00127b4c:
      __assert_fail("0 && \"Unknown event type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                    ,0x5c,
                    "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
                   );
    }
LAB_001279ef:
    local_78 = DELETED;
  }
  else {
    if (uVar3 != 0x80) {
      if (uVar3 == 0x200) goto LAB_001279ef;
      if (uVar3 != 0x100) goto LAB_00127b4c;
    }
    local_78 = CREATED;
  }
LAB_00127a01:
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](this_00,(key_type_conflict *)&local_88);
  std::__cxx11::string::_M_assign((string *)&local_70);
  pcVar8 = pcVar8 + this->read_buffer_offset_;
  local_50[0] = local_40;
  sVar6 = strlen(pcVar8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar8,pcVar8 + sVar6);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((local_88 & 0x4000000000000000) != 0) {
    std::__cxx11::string::push_back((char)(string *)&local_70);
  }
  uVar4 = (uStack_80 >> 0x20) + this->read_buffer_offset_;
  this->read_buffer_offset_ = uVar4;
  if (uVar4 <= this->read_buffer_length_) {
    (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.type =
         local_78;
    paVar1 = &(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.
              path.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0 + 8) =
         paVar1;
    if (local_70 == &local_60) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload
               .path.field_2 + 8) = uStack_58;
    }
    else {
      (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path.
      _M_dataplus._M_p = local_70;
      (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path.
      field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>).field_0._M_payload.path.
    _M_string_length = local_68;
    (__return_storage_ptr__->super__Optional_base<InotifyEvent,_true>)._M_engaged = true;
    return __return_storage_ptr__;
  }
  __assert_fail("read_buffer_offset_ <= read_buffer_length_ && \"Attempted to escape read buffer\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                ,0x66,
                "virtual std::experimental::optional<InotifyEvent> NonrecursiveInotifyPoller::GetNextEvent()"
               );
}

Assistant:

std::experimental::optional<InotifyEvent>
NonrecursiveInotifyPoller::GetNextEvent() {
  struct inotify_event ev;
  for (;;) {
    // Read new events from the kernel if needed.
    if (read_buffer_offset_ + sizeof(struct inotify_event) >
        read_buffer_length_) {
      ssize_t readlen = read(fd_, read_buffer_, sizeof(read_buffer_));
      if (readlen == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))
        return {};
      assert(readlen >= (ssize_t)sizeof(struct inotify_event) &&
             "inotify read failed");
      read_buffer_offset_ = 0;
      read_buffer_length_ = readlen;
    }

    // Copy next event from read buffer to get the alignment right.
    memcpy(&ev, read_buffer_ + read_buffer_offset_, sizeof(ev));
    read_buffer_offset_ += sizeof(ev);
    assert(read_buffer_offset_ <= read_buffer_length_ &&
           "Attempted to escape read buffer");

    // If the kernel is going to discard this watch, remove it from our
    // bookkeeping as well.
    if ((ev.mask & IN_IGNORED) != 0)
      directories_.erase(ev.wd);

    // Record that we've been dropping events.
    if ((ev.mask & IN_Q_OVERFLOW) != 0)
      events_dropped_ = true;

    if (ev.len > 0) {
      // Extract the event type.
      InotifyEvent event;
      switch (ev.mask & IN_ALL_EVENTS) {
        case IN_CREATE:
        case IN_MOVED_TO:
          event.type = InotifyEventType::CREATED;
          break;
        case IN_DELETE:
        case IN_MOVED_FROM:
          event.type = InotifyEventType::DELETED;
          break;
        case IN_MODIFY:
          event.type = InotifyEventType::MODIFIED;
          break;
        default:
          assert(0 && "Unknown event type");
      }

      // Extract the pathname string.
      event.path = directories_[ev.wd];
      event.path += std::string(read_buffer_ + read_buffer_offset_);
      if ((ev.mask & IN_ISDIR) != 0)
        event.path += '/';
      read_buffer_offset_ += ev.len;
      assert(read_buffer_offset_ <= read_buffer_length_ &&
             "Attempted to escape read buffer");
      return event;
    }
  }
}